

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O1

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,_1,false>,Eigen::internal::assign_op<double,double>>
               (Matrix<double,__1,__1,_0,__1,__1> *dst,
               Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *src,
               assign_op<double,_double> *func)

{
  PointerType pdVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  double *pdVar5;
  undefined1 auVar6 [16];
  double dVar7;
  Index innerSize;
  undefined8 *puVar8;
  Index outerSize;
  Index col;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  double *pdVar12;
  PointerType pdVar13;
  Index inner;
  long lVar14;
  Index row;
  ulong uVar15;
  
  pdVar1 = (src->
           super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
           ).
           super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
           .
           super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
           .m_data;
  uVar2 = (src->
          super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
          ).
          super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
          .
          super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
          .m_rows.m_value;
  lVar3 = (src->
          super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
          ).
          super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
          .m_outerStride;
  uVar11 = (src->
           super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
           ).
           super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
           .
           super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
           .m_cols.m_value;
  if (((dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows !=
       uVar2) ||
     ((dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols !=
      uVar11)) {
    if ((long)(uVar11 | uVar2) < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/PlainObjectBase.h"
                    ,0x11d,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                   );
    }
    if ((uVar11 != 0 && uVar2 != 0) &&
       (auVar6 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
       SUB168(auVar6 / SEXT816((long)uVar11),0) < (long)uVar2)) {
      puVar8 = (undefined8 *)
               __cxa_allocate_exception(8,src,SUB168(auVar6 % SEXT816((long)uVar11),0));
      *puVar8 = operator_delete;
      __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)dst,uVar11 * uVar2,uVar2,uVar11);
  }
  uVar4 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  if ((uVar4 == uVar2) &&
     (uVar2 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_cols, uVar2 == uVar11)) {
    if (0 < (long)uVar2) {
      pdVar5 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_data;
      uVar11 = 0;
      uVar9 = 0;
      pdVar12 = pdVar5;
      pdVar13 = pdVar1;
      do {
        if (0 < (long)uVar11) {
          pdVar5[uVar9 * uVar4] = pdVar1[uVar9 * lVar3];
        }
        uVar10 = uVar4 - uVar11 & 0xfffffffffffffffe;
        lVar14 = uVar11 + uVar10;
        uVar15 = uVar11;
        if (0 < (long)uVar10) {
          do {
            dVar7 = (pdVar13 + uVar15)[1];
            pdVar12[uVar15] = pdVar13[uVar15];
            (pdVar12 + uVar15)[1] = dVar7;
            uVar15 = uVar15 + 2;
          } while ((long)uVar15 < lVar14);
        }
        for (; lVar14 < (long)uVar4; lVar14 = lVar14 + 1) {
          pdVar12[lVar14] = pdVar13[lVar14];
        }
        uVar11 = (long)(uVar11 + ((uint)uVar4 & 1)) % 2;
        if ((long)uVar4 < (long)uVar11) {
          uVar11 = uVar4;
        }
        uVar9 = uVar9 + 1;
        pdVar13 = pdVar13 + lVar3;
        pdVar12 = pdVar12 + uVar4;
      } while (uVar9 != uVar2);
    }
    return;
  }
  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/AssignEvaluator.h"
                ,0x2d1,
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::Block<const Eigen::Matrix<double, -1, -1>>, T1 = double, T2 = double]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);
    
  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}